

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

void __thiscall llbuild::buildsystem::BuildFile::~BuildFile(BuildFile *this)

{
  BuildFileImpl *this_00;
  BuildFile *this_local;
  
  this_00 = (BuildFileImpl *)this->impl;
  if (this_00 != (BuildFileImpl *)0x0) {
    anon_unknown.dwarf_f105d::BuildFileImpl::~BuildFileImpl(this_00);
    operator_delete(this_00,0xd0);
  }
  return;
}

Assistant:

BuildFile::~BuildFile() {
  delete static_cast<BuildFileImpl*>(impl);
}